

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_move16_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  uint32_t val;
  TCGv_i32 pTVar2;
  TCGv_i32 src;
  TCGv_i32 dst;
  TCGv_i32 *ppTVar3;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = ((s->base).tb)->flags;
  ppTVar3 = s->writeback;
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar3 = tcg_ctx->cpu_aregs;
  }
  ret = ppTVar3[insn & 7];
  val = read_im32(env,s);
  pTVar2 = tcg_const_i32_m68k(tcg_ctx,val);
  src = pTVar2;
  dst = ret;
  if ((insn & 8) == 0) {
    src = ret;
    dst = pTVar2;
  }
  m68k_copy_line(tcg_ctx,dst,src,(uint)((uVar1 >> 0xd & 1) == 0));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  if ((insn & 0x10) != 0) {
    return;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,0x10);
  return;
}

Assistant:

DISAS_INSN(move16_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv reg, addr;

    reg = AREG(insn, 0);
    addr = tcg_const_i32(tcg_ctx, read_im32(env, s));

    if ((insn >> 3) & 1) {
        /* MOVE16 (xxx).L, (Ay) */
        m68k_copy_line(tcg_ctx, reg, addr, index);
    } else {
        /* MOVE16 (Ay), (xxx).L */
        m68k_copy_line(tcg_ctx, addr, reg, index);
    }

    tcg_temp_free(tcg_ctx, addr);

    if (((insn >> 3) & 2) == 0) {
        /* (Ay)+ */
        tcg_gen_addi_i32(tcg_ctx, reg, reg, 16);
    }
}